

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors.cpp
# Opt level: O3

void __thiscall SensorBase::resume_worker(SensorBase *this)

{
  int iVar1;
  
  std::
  vector<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scan_t>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scan_t>_>_>
  ::_M_erase_at_end(&this->enabled_scan_elem,
                    (this->enabled_scan_elem).
                    super__Vector_base<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scan_t>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scan_t>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  (**this->_vptr_SensorBase)(this);
  (*this->_vptr_SensorBase[1])(this);
  enable_buffer(this);
  iVar1 = open((this->devbufpath)._M_pathname._M_dataplus._M_p,0);
  this->devfd = iVar1;
  if (iVar1 != -1) {
    this->paused = 0;
    pthread_mutex_unlock((pthread_mutex_t *)&this->read_m);
    return;
  }
  resume_worker((SensorBase *)&this->devbufpath);
  return;
}

Assistant:

void SensorBase::resume_worker()
{
	enabled_scan_elem.clear();
	enable_scan_elements();
	update_values();
	enable_buffer();
	devfd=open(devbufpath.c_str(),O_RDONLY);
	if(!~devfd)
		return (void)LOG('E',"failed to open the iio buffer device: %s",devbufpath.c_str());
	paused=0;
	read_m.unlock();
}